

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteGeometry(ColladaExporter *this,size_t pIndex)

{
  undefined1 *puVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  aiMesh *paVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  int iVar8;
  size_t a;
  long lVar9;
  ulong uVar10;
  aiFace *paVar11;
  ulong uVar12;
  int iVar13;
  size_t a_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string geometryId;
  string idstr;
  string geometryName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_278;
  long local_270;
  ulong local_268 [2];
  allocator<char> local_251;
  string local_250;
  string local_230;
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  string *local_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  paVar5 = this->mScene->mMeshes[pIndex];
  if ((paVar5->mName).length == 0) {
    GetMeshId_abi_cxx11_(&local_1e8,this,pIndex);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,(paVar5->mName).data,&local_251);
  }
  XMLEscape(&local_1c8,&local_1e8);
  XMLIDEncode(&local_230,&local_1e8);
  if ((paVar5->mNumFaces != 0) && (paVar5->mNumVertices != 0)) {
    puVar1 = &this->field_0x38;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<geometry id=\"",0xe);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" name=\"",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" >",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    local_1f0 = &this->startstr;
    std::__cxx11::string::append((char *)local_1f0);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<mesh>",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    paVar3 = &local_1a8[0].field_2;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append((char *)local_1a8);
    WriteFloatArray(this,local_1a8,FloatType_Vector,&paVar5->mVertices->x,
                    (ulong)paVar5->mNumVertices);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((paVar5->mNormals != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_1e8._M_dataplus._M_p,
                 local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
      std::__cxx11::string::append((char *)local_1a8);
      WriteFloatArray(this,local_1a8,FloatType_Vector,&paVar5->mNormals->x,
                      (ulong)paVar5->mNumVertices);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    paVar3 = &local_250.field_2;
    lVar9 = 0;
    do {
      if ((paVar5->mTextureCoords[lVar9] != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
        local_278 = local_268;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_1e8._M_dataplus._M_p,
                   local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
        std::__cxx11::string::append((char *)&local_278);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar10 = 0xf;
        if (local_278 != local_268) {
          uVar10 = local_268[0];
        }
        if (uVar10 < (ulong)(local_208 + local_270)) {
          uVar10 = 0xf;
          if (local_210 != local_200) {
            uVar10 = local_200[0];
          }
          if (uVar10 < (ulong)(local_208 + local_270)) goto LAB_0032025d;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_278);
        }
        else {
LAB_0032025d:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_210);
        }
        psVar2 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_250.field_2._M_allocated_capacity = *psVar2;
          local_250.field_2._8_8_ = puVar7[3];
          local_250._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar2;
          local_250._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_250._M_string_length = puVar7[1];
        *puVar7 = psVar2;
        puVar7[1] = 0;
        *(undefined1 *)psVar2 = 0;
        WriteFloatArray(this,&local_250,(paVar5->mNumUVComponents[lVar9] == 3) + FloatType_TexCoord2
                        ,&paVar5->mTextureCoords[lVar9]->x,(ulong)paVar5->mNumVertices);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar3) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
        if (local_278 != local_268) {
          operator_delete(local_278,local_268[0] + 1);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    lVar9 = 0;
    do {
      if ((paVar5->mColors[lVar9] != (aiColor4D *)0x0) && (paVar5->mNumVertices != 0)) {
        local_278 = local_268;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_1e8._M_dataplus._M_p,
                   local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
        std::__cxx11::string::append((char *)&local_278);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar10 = 0xf;
        if (local_278 != local_268) {
          uVar10 = local_268[0];
        }
        if (uVar10 < (ulong)(local_208 + local_270)) {
          uVar10 = 0xf;
          if (local_210 != local_200) {
            uVar10 = local_200[0];
          }
          if (uVar10 < (ulong)(local_208 + local_270)) goto LAB_00320432;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_278);
        }
        else {
LAB_00320432:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_210);
        }
        psVar2 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_250.field_2._M_allocated_capacity = *psVar2;
          local_250.field_2._8_8_ = puVar7[3];
          local_250._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar2;
          local_250._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_250._M_string_length = puVar7[1];
        *puVar7 = psVar2;
        puVar7[1] = 0;
        *(undefined1 *)psVar2 = 0;
        WriteFloatArray(this,&local_250,FloatType_Color,&paVar5->mColors[lVar9]->r,
                        (ulong)paVar5->mNumVertices);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar3) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
        if (local_278 != local_268) {
          operator_delete(local_278,local_268[0] + 1);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<vertices id=\"",0xe);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-vertices",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\">",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)local_1f0);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"<input semantic=\"POSITION\" source=\"#",0x24);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-positions\" />",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    PopTag(this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</vertices>",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    if ((ulong)paVar5->mNumFaces == 0) {
      iVar13 = 0;
      iVar8 = 0;
    }
    else {
      lVar9 = 0;
      iVar8 = 0;
      iVar13 = 0;
      do {
        uVar4 = *(uint *)((long)&paVar5->mFaces->mNumIndices + lVar9);
        iVar8 = (iVar8 + 1) - (uint)(uVar4 < 3);
        iVar13 = iVar13 + (uint)(uVar4 == 2);
        lVar9 = lVar9 + 0x10;
      } while ((ulong)paVar5->mNumFaces << 4 != lVar9);
    }
    if (iVar13 != 0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<lines count=\"",0xe);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\" material=\"defaultMaterial\">",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"<input offset=\"0\" semantic=\"VERTEX\" source=\"#",0x2d);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-vertices\" />",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((paVar5->mNormals != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"<input semantic=\"NORMAL\" source=\"#",0x22);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-normals\" />",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      }
      lVar9 = 0;
      do {
        if ((paVar5->mTextureCoords[lVar9] != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                              (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"<input semantic=\"TEXCOORD\" source=\"#",0x24);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-tex",4);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"set=\"",5);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," />",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      lVar9 = 0;
      do {
        if ((paVar5->mColors[lVar9] != (aiColor4D *)0x0) && (paVar5->mNumVertices != 0)) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                              (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"<input semantic=\"COLOR\" source=\"#",0x21);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-color",6);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"set=\"",5);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," />",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<p>",3);
      if (paVar5->mNumFaces != 0) {
        uVar10 = 0;
        do {
          if ((paVar5->mFaces[uVar10].mNumIndices == 2) &&
             (paVar11 = paVar5->mFaces + uVar10, paVar11->mNumIndices != 0)) {
            uVar12 = 0;
            do {
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              uVar12 = uVar12 + 1;
            } while (uVar12 < paVar11->mNumIndices);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < paVar5->mNumFaces);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</p>",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      PopTag(this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</lines>",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    }
    if (iVar8 != 0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<polylist count=\"",0x11);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\" material=\"defaultMaterial\">",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      std::__cxx11::string::append((char *)local_1f0);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"<input offset=\"0\" semantic=\"VERTEX\" source=\"#",0x2d);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-vertices\" />",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((paVar5->mNormals != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"<input offset=\"0\" semantic=\"NORMAL\" source=\"#",0x2d);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-normals\" />",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      }
      lVar9 = 0;
      do {
        if ((paVar5->mTextureCoords[lVar9] != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                              (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"<input offset=\"0\" semantic=\"TEXCOORD\" source=\"#",0x2f);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-tex",4);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"set=\"",5);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," />",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      lVar9 = 0;
      do {
        if ((paVar5->mColors[lVar9] != (aiColor4D *)0x0) && (paVar5->mNumVertices != 0)) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                              (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"<input offset=\"0\" semantic=\"COLOR\" source=\"#",0x2c);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-color",6);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"set=\"",5);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," />",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<vcount>",8);
      if (paVar5->mNumFaces != 0) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          if (2 < *(uint *)((long)&paVar5->mFaces->mNumIndices + lVar9)) {
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar10 < paVar5->mNumFaces);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</vcount>",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<p>",3);
      if (paVar5->mNumFaces != 0) {
        uVar10 = 0;
        do {
          if ((2 < paVar5->mFaces[uVar10].mNumIndices) &&
             (paVar11 = paVar5->mFaces + uVar10, paVar11->mNumIndices != 0)) {
            uVar12 = 0;
            do {
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              uVar12 = uVar12 + 1;
            } while (uVar12 < paVar11->mNumIndices);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < paVar5->mNumFaces);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</p>",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      PopTag(this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</polylist>",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    }
    PopTag(this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</mesh>",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    PopTag(this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</geometry>",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteGeometry( size_t pIndex)
{
    const aiMesh* mesh = mScene->mMeshes[pIndex];
    const std::string idstr = mesh->mName.length == 0 ? GetMeshId(pIndex) : mesh->mName.C_Str();
    const std::string geometryName = XMLEscape(idstr);
    const std::string geometryId = XMLIDEncode(idstr);

    if ( mesh->mNumFaces == 0 || mesh->mNumVertices == 0 )
        return;

    // opening tag
    mOutput << startstr << "<geometry id=\"" << geometryId << "\" name=\"" << geometryName << "\" >" << endstr;
    PushTag();

    mOutput << startstr << "<mesh>" << endstr;
    PushTag();

    // Positions
    WriteFloatArray( idstr + "-positions", FloatType_Vector, (ai_real*) mesh->mVertices, mesh->mNumVertices);
    // Normals, if any
    if( mesh->HasNormals() )
        WriteFloatArray( idstr + "-normals", FloatType_Vector, (ai_real*) mesh->mNormals, mesh->mNumVertices);

    // texture coords
    for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a)
    {
        if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
        {
            WriteFloatArray( idstr + "-tex" + to_string(a), mesh->mNumUVComponents[a] == 3 ? FloatType_TexCoord3 : FloatType_TexCoord2,
                (ai_real*) mesh->mTextureCoords[a], mesh->mNumVertices);
        }
    }

    // vertex colors
    for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a)
    {
        if( mesh->HasVertexColors(static_cast<unsigned int>(a)) )
            WriteFloatArray( idstr + "-color" + to_string(a), FloatType_Color, (ai_real*) mesh->mColors[a], mesh->mNumVertices);
    }

    // assemble vertex structure
    // Only write input for POSITION since we will write other as shared inputs in polygon definition
    mOutput << startstr << "<vertices id=\"" << geometryId << "-vertices" << "\">" << endstr;
    PushTag();
    mOutput << startstr << "<input semantic=\"POSITION\" source=\"#" << geometryId << "-positions\" />" << endstr;
    PopTag();
    mOutput << startstr << "</vertices>" << endstr;

    // count the number of lines, triangles and polygon meshes
    int countLines = 0;
    int countPoly = 0;
    for( size_t a = 0; a < mesh->mNumFaces; ++a )
    {
        if (mesh->mFaces[a].mNumIndices == 2) countLines++;
        else if (mesh->mFaces[a].mNumIndices >= 3) countPoly++;
    }

    // lines
    if (countLines)
    {
        mOutput << startstr << "<lines count=\"" << countLines << "\" material=\"defaultMaterial\">" << endstr;
        PushTag();
        mOutput << startstr << "<input offset=\"0\" semantic=\"VERTEX\" source=\"#" << geometryId << "-vertices\" />" << endstr;
        if( mesh->HasNormals() )
            mOutput << startstr << "<input semantic=\"NORMAL\" source=\"#" << geometryId << "-normals\" />" << endstr;
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
                mOutput << startstr << "<input semantic=\"TEXCOORD\" source=\"#" << geometryId << "-tex" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( mesh->HasVertexColors(static_cast<unsigned int>(a) ) )
                mOutput << startstr << "<input semantic=\"COLOR\" source=\"#" << geometryId << "-color" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }

        mOutput << startstr << "<p>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            const aiFace& face = mesh->mFaces[a];
            if (face.mNumIndices != 2) continue;
            for( size_t b = 0; b < face.mNumIndices; ++b )
                mOutput << face.mIndices[b] << " ";
        }
        mOutput << "</p>" << endstr;
        PopTag();
        mOutput << startstr << "</lines>" << endstr;
    }

    // triangle - don't use it, because compatibility problems

    // polygons
    if (countPoly)
    {
        mOutput << startstr << "<polylist count=\"" << countPoly << "\" material=\"defaultMaterial\">" << endstr;
        PushTag();
        mOutput << startstr << "<input offset=\"0\" semantic=\"VERTEX\" source=\"#" << geometryId << "-vertices\" />" << endstr;
        if( mesh->HasNormals() )
            mOutput << startstr << "<input offset=\"0\" semantic=\"NORMAL\" source=\"#" << geometryId << "-normals\" />" << endstr;
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
                mOutput << startstr << "<input offset=\"0\" semantic=\"TEXCOORD\" source=\"#" << geometryId << "-tex" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( mesh->HasVertexColors(static_cast<unsigned int>(a) ) )
                mOutput << startstr << "<input offset=\"0\" semantic=\"COLOR\" source=\"#" << geometryId << "-color" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }

        mOutput << startstr << "<vcount>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            if (mesh->mFaces[a].mNumIndices < 3) continue;
            mOutput << mesh->mFaces[a].mNumIndices << " ";
        }
        mOutput << "</vcount>" << endstr;

        mOutput << startstr << "<p>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            const aiFace& face = mesh->mFaces[a];
            if (face.mNumIndices < 3) continue;
            for( size_t b = 0; b < face.mNumIndices; ++b )
                mOutput << face.mIndices[b] << " ";
        }
        mOutput << "</p>" << endstr;
        PopTag();
        mOutput << startstr << "</polylist>" << endstr;
    }

    // closing tags
    PopTag();
    mOutput << startstr << "</mesh>" << endstr;
    PopTag();
    mOutput << startstr << "</geometry>" << endstr;
}